

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_window.cpp
# Opt level: O0

Am_Value_List get_new_slots_and_values(Am_Object *cmd,Am_Value *new_value,Am_Value *new_obj_val)

{
  bool bVar1;
  Am_Slot_Key key_00;
  Am_Value *pAVar2;
  Am_Wrapper *value;
  ostream *poVar3;
  void *this;
  Am_Value *in_RCX;
  Am_List_Item *extraout_RDX;
  Am_Value_List AVar4;
  Am_Value local_80;
  Am_Assoc local_70;
  undefined1 local_68 [8];
  Am_Value target_v;
  undefined1 local_50 [6];
  Am_Am_Slot_Key key;
  Am_Value_List just_slots;
  Am_Object local_30;
  Am_Object fake_start_object;
  Am_Value *new_obj_val_local;
  Am_Value *new_value_local;
  Am_Object *cmd_local;
  Am_Value_List *slots_and_values_used;
  
  Am_Object::Am_Object(&local_30);
  bVar1 = Am_Value::Valid(in_RCX);
  if ((bVar1) && (in_RCX->type == 0xa001)) {
    Am_Object::operator=(&local_30,in_RCX);
  }
  else {
    pAVar2 = Am_Object::Get((Am_Object *)new_value,0x11a,0);
    Am_Object::operator=(&local_30,pAVar2);
  }
  Am_Value_List::Am_Value_List((Am_Value_List *)cmd);
  pAVar2 = Am_Object::Get(&local_30,0xb8,0);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_50,pAVar2);
  Am_Am_Slot_Key::Am_Am_Slot_Key((Am_Am_Slot_Key *)((long)&target_v.value + 6),0);
  Am_Value::Am_Value((Am_Value *)local_68);
  Am_Value_List::Start((Am_Value_List *)local_50);
  while (bVar1 = Am_Value_List::Last((Am_Value_List *)local_50), ((bVar1 ^ 0xffU) & 1) != 0) {
    pAVar2 = Am_Value_List::Get((Am_Value_List *)local_50);
    Am_Am_Slot_Key::operator=((Am_Am_Slot_Key *)((long)&target_v.value + 6),pAVar2);
    key_00 = Am_Am_Slot_Key::operator_cast_to_unsigned_short
                       ((Am_Am_Slot_Key *)((long)&target_v.value + 6));
    pAVar2 = Am_Object::Get(&local_30,key_00,0);
    Am_Value::operator=((Am_Value *)local_68,pAVar2);
    Am_Am_Slot_Key::operator_cast_to_Am_Value((Am_Am_Slot_Key *)&local_80);
    Am_Assoc::Am_Assoc(&local_70,&local_80,(Am_Value *)local_68);
    value = Am_Assoc::operator_cast_to_Am_Wrapper_(&local_70);
    Am_Value_List::Add((Am_Value_List *)cmd,value,Am_TAIL,true);
    Am_Assoc::~Am_Assoc(&local_70);
    Am_Value::~Am_Value(&local_80);
    Am_Value_List::Next((Am_Value_List *)local_50);
  }
  if ((am_sdebug & 1U) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Create new slots_and_values_used from ");
    poVar3 = operator<<(poVar3,(Am_Object *)new_value);
    poVar3 = std::operator<<(poVar3," and new val ");
    poVar3 = operator<<(poVar3,new_obj_val);
    poVar3 = std::operator<<(poVar3," start object ");
    poVar3 = operator<<(poVar3,&local_30);
    poVar3 = std::operator<<(poVar3," list ");
    poVar3 = operator<<(poVar3,(Am_Value_List *)cmd);
    this = (void *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(this,std::flush<char,std::char_traits<char>>);
  }
  Am_Value::~Am_Value((Am_Value *)local_68);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_50);
  Am_Object::~Am_Object(&local_30);
  AVar4.item = extraout_RDX;
  AVar4.data = (Am_Value_List_Data *)cmd;
  return AVar4;
}

Assistant:

Am_Value_List
get_new_slots_and_values(Am_Object &cmd, Am_Value &new_value,
                         Am_Value new_obj_val)
{
  Am_Object fake_start_object;
  if (new_obj_val.Valid() && new_obj_val.type == Am_OBJECT)
    fake_start_object = new_obj_val;
  else
    fake_start_object = cmd.Get(Am_START_OBJECT);
  // **** do something with new_value ****
  Am_Value_List slots_and_values_used;
  Am_Value_List just_slots = fake_start_object.Get(Am_SLOTS_TO_SAVE);
  Am_Am_Slot_Key key;
  Am_Value target_v;
  for (just_slots.Start(); !just_slots.Last(); just_slots.Next()) {
    key = just_slots.Get();
    target_v = fake_start_object.Get(key);
    slots_and_values_used.Add(Am_Assoc(key, target_v));
  }
  if (am_sdebug)
    std::cout << "Create new slots_and_values_used from " << cmd
              << " and new val " << new_value << " start object "
              << fake_start_object << " list " << slots_and_values_used
              << std::endl
              << std::flush;
  return slots_and_values_used;
}